

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O2

void Imf_2_5::Xdr::read<Imf_2_5::CharPtrIO,char_const*>(char **in,unsigned_long *v)

{
  uchar in_RAX [8];
  uchar b [8];
  
  b = in_RAX;
  CharPtrIO::readChars(in,(char *)b,8);
  *v = (unsigned_long)b;
  return;
}

Assistant:

void
read (T &in, unsigned long &v)
{
    unsigned char b[8];

    readUnsignedChars<S> (in, b, 8);

    #if ULONG_MAX == 4294967295U

	v =  (b[0]        & 0x000000ff) |
	    ((b[1] << 8)  & 0x0000ff00) |
	    ((b[2] << 16) & 0x00ff0000) |
	     (b[3] << 24);

	if (b[4] || b[5] || b[6] || b[7])
	{
	    throw IEX_NAMESPACE::OverflowExc ("Long int overflow - read a large "
				    "64-bit integer in a 32-bit process.");
	}

    #elif ULONG_MAX == 18446744073709551615LU

	v =  ((unsigned long) b[0]        & 0x00000000000000ff) |
	    (((unsigned long) b[1] << 8)  & 0x000000000000ff00) |
	    (((unsigned long) b[2] << 16) & 0x0000000000ff0000) |
	    (((unsigned long) b[3] << 24) & 0x00000000ff000000) |
	    (((unsigned long) b[4] << 32) & 0x000000ff00000000) |
	    (((unsigned long) b[5] << 40) & 0x0000ff0000000000) |
	    (((unsigned long) b[6] << 48) & 0x00ff000000000000) |
	     ((unsigned long) b[7] << 56);

    #else

	#error read<T> (T &in, unsigned long &v) not implemented

    #endif
}